

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::pipeline::ImageSamplingInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageSamplingInstance *this)

{
  VkResult VVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkQueue pVVar4;
  VkSubmitInfo submitInfo;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Move<vk::VkCommandBuffer_s_*> *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pDVar2 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar3 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar4 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  uStack_70 = 0;
  local_58 = 0;
  uStack_40 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_38 = 0;
  local_78 = 4;
  uStack_50 = 1;
  local_48 = &this->m_cmdBuffer;
  VVar1 = (*pDVar2->_vptr_DeviceInterface[0x14])(pDVar2,pVVar3,1,&this->m_fence);
  ::vk::checkResult(VVar1,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineImageSamplingInstance.cpp"
                    ,0x315);
  VVar1 = (*pDVar2->_vptr_DeviceInterface[2])
                    (pDVar2,pVVar4,1,&local_78,
                     (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineImageSamplingInstance.cpp"
                    ,0x316);
  VVar1 = (*pDVar2->_vptr_DeviceInterface[0x16])
                    (pDVar2,pVVar3,1,&this->m_fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar1,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineImageSamplingInstance.cpp"
                    ,0x317);
  verifyImage(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ImageSamplingInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));

	return verifyImage();
}